

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

ByteMaskType * __thiscall
findstr::make_unicode_bytemask
          (ByteMaskType *__return_storage_ptr__,findstr *this,ByteMaskType *bm,int size)

{
  pointer puVar1;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *ppVar2;
  uint uVar3;
  ulong uVar4;
  ByteVector mask;
  ByteVector data;
  uchar local_71;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  local_70 = __return_storage_ptr__;
  while( true ) {
    ppVar2 = local_70;
    uVar4 = (ulong)uVar3;
    puVar1 = (bm->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(bm->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar4) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,puVar1 + uVar4);
    local_71 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&local_71);
    if (size == 4) {
      local_71 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&local_71);
      local_71 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&local_71);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               (bm->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar4);
    local_71 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&local_71);
    if (size == 4) {
      local_71 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&local_71);
      local_71 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&local_71);
    }
    uVar3 = uVar3 + 1;
  }
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
            (local_70,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return ppVar2;
}

Assistant:

ByteMaskType make_unicode_bytemask(const ByteMaskType& bm, int size)
    {
        ByteVector data;
        ByteVector mask;
        for (unsigned i = 0 ; i < bm.first.size() ; i++)
        {
            data.push_back(bm.first[i]);
            data.push_back(0);
            if (size == 4) {
                data.push_back(0);
                data.push_back(0);
            }
            mask.push_back(bm.second[i]);
            mask.push_back(0);
            if (size == 4) {
                mask.push_back(0);
                mask.push_back(0);
            }
        }
        return std::make_pair(data, mask);
    }